

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::loadMatrixVecs(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this)

{
  long lVar1;
  SPxOut *pSVar2;
  char cVar3;
  long lVar4;
  undefined8 in_RAX;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Verbosity old_verbosity;
  undefined8 local_28;
  
  pSVar2 = this->spxout;
  local_28 = in_RAX;
  if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
    local_28 = CONCAT44(pSVar2->m_verbosity,5);
    (*pSVar2->_vptr_SPxOut[2])();
    pSVar2 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar2->m_streams[pSVar2->m_verbosity],
               "IBASIS01 loadMatrixVecs() invalidates factorization",0x33);
    cVar3 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18) +
                    cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,(long)&local_28 + 4);
  }
  this->nzCount = 0;
  lVar7 = (long)(this->theLP->thecovectors->set).thenum;
  if (0 < lVar7) {
    lVar6 = 1;
    lVar4 = lVar7 * 8;
    do {
      lVar8 = lVar4 + -8;
      pSVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::vector(this->theLP,
                        (SPxId *)((long)&(this->theBaseId).data[-1].super_DataKey.info + lVar4));
      *(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)((long)(this->matrix).data + lVar8) = pSVar5;
      this->nzCount = this->nzCount + *(int *)(*(long *)((long)(this->matrix).data + lVar8) + 0xc);
      lVar1 = lVar7 + lVar6;
      lVar6 = lVar6 + -1;
      lVar4 = lVar8;
    } while (1 < lVar1 + -1);
  }
  this->matrixIsSetup = true;
  this->factorized = false;
  if (this->factor !=
      (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    (*this->factor->_vptr_SLinSolver[2])();
  }
  return;
}

Assistant:

void SPxBasisBase<R>::loadMatrixVecs()
{
   assert(theLP != nullptr);
   assert(theLP->dim() == matrix.size());

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS01 loadMatrixVecs() invalidates factorization"
                 << std::endl;)

   int i;
   nzCount = 0;

   for(i = theLP->dim() - 1; i >= 0; --i)
   {
      matrix[i] = &theLP->vector(baseId(i));
      nzCount += matrix[i]->size();
   }

   matrixIsSetup = true;
   factorized = false;

   if(factor != nullptr)
      factor->clear();
}